

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O1

void gb_common_writes(MemoryBankController *mc,uint16_t address,uint8_t data)

{
  undefined6 in_register_00000032;
  
  if ((uint)CONCAT62(in_register_00000032,address) < 0x2000) {
    mc->ram_enabled = (data & 0xf) == 10;
    return;
  }
  if ((ushort)(address + 0x160) < 0x5f) {
    return;
  }
  if (address == 0xff46) {
    gb_dma_transfer(mc,data);
    return;
  }
  if (address != 0xff44) {
    if (address == 0xff04) {
      mc->memory[address] = '\0';
      mc->div_register = 0;
      return;
    }
    mc->memory[address] = data;
    return;
  }
  mc->memory[address] = '\0';
  return;
}

Assistant:

void gb_common_writes(MemoryBankController* mc, uint16_t address, uint8_t data) {
    
    if(address <= 0x1FFF) {
        mc->ram_enabled = ((data & 0x0F) == 0x0A);
        return;
    }

    if (address >= 0xFEA0 && address < 0xFEFF) {
        return;
    }

    switch (address) {
    case DIV:
        mc->memory[address] = 0;
        mc->div_register = 0;
        break;
    case DMA:
        gb_dma_transfer(mc, data);
        break;
    case LY:
        mc->memory[address] = 0;
        break;
    default:
        mc->memory[address] = data;
        break;
    }
}